

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestCaseForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *result_00;
  char *__s;
  TestResult *in_RSI;
  ostream *in_RDI;
  size_t in_stack_fffffffffffffb38;
  ostream *width;
  allocator<char> *in_stack_fffffffffffffb40;
  allocator<char> *__a;
  char *in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 comma;
  string *indent;
  string *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc08;
  ostream *in_stack_fffffffffffffc10;
  string local_3e0 [32];
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  TimeInMillis in_stack_fffffffffffffcb8;
  string local_328 [32];
  string local_308 [39];
  undefined1 local_2e1 [40];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [16];
  TimeInMillis in_stack_fffffffffffffd78;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [8];
  TestResult *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [48];
  string local_30;
  TestResult *local_10;
  ostream *local_8;
  
  indent = &local_30;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Indent_abi_cxx11_(in_stack_fffffffffffffb38);
  result_00 = (TestResult *)std::operator<<(in_RDI,(string *)indent);
  comma = (undefined1)((ulong)in_RDI >> 0x38);
  std::operator<<((ostream *)result_00,"{\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  Indent_abi_cxx11_(in_stack_fffffffffffffb38);
  OutputJsonKey(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (string *)result_00,indent,(bool)comma);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  Indent_abi_cxx11_(in_stack_fffffffffffffb38);
  OutputJsonKey(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (string *)result_00,indent,(bool)comma);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  Indent_abi_cxx11_(in_stack_fffffffffffffb38);
  OutputJsonKey(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (string *)result_00,indent,(bool)comma);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  TestResult::start_timestamp(local_10);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffffd78);
  Indent_abi_cxx11_(in_stack_fffffffffffffb38);
  OutputJsonKey(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (string *)result_00,indent,(bool)comma);
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  __s = (char *)TestResult::elapsed_time(local_10);
  FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffcb8);
  Indent_abi_cxx11_(in_stack_fffffffffffffb38);
  OutputJsonKey(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (string *)result_00,indent,(bool)comma);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)(local_2e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  __a = &local_349;
  width = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
  Indent_abi_cxx11_((size_t)width);
  OutputJsonKey(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (string *)result_00,indent,(bool)comma);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
  std::allocator<char>::~allocator(&local_349);
  Indent_abi_cxx11_((size_t)width);
  TestPropertiesAsJson(result_00,indent);
  std::operator<<(local_8,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc00);
  OutputJsonTestResult(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestCaseForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);
}